

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::comptype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  undefined8 *puVar1;
  Type TVar2;
  undefined1 uVar3;
  _Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *p_Var4;
  _Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *p_Var5;
  StructT *type_00;
  Signature signature;
  string local_e8;
  undefined1 auStack_c8 [8];
  MaybeResult<wasm::Signature> _val;
  __index_type local_98;
  undefined1 auStack_88 [8];
  MaybeResult<wasm::Signature> type;
  __index_type local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  functype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Signature> *)auStack_88,ctx);
  uVar3 = type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_;
  if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_88)
    ;
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_c8,
                    (_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_88);
    if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
    {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,auStack_c8,
                 (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage.params.id + (long)auStack_c8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_50 == &local_40) {
        *puVar1 = CONCAT71(uStack_3f,local_40);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_50;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_3f,local_40);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
      local_48 = 0;
      local_40 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_50 = &local_40;
      std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)
                        auStack_c8);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)
                        auStack_c8);
      p_Var4 = (_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)0x0;
      if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0')
      {
        p_Var4 = (_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_88;
      }
      signature.results.id =
           (p_Var4->super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>)._M_u.
           _M_first._M_storage.results.id;
      signature.params.id = (uintptr_t)auStack_88;
      TypeBuilder::setHeapType(ctx->builder,(ulong)ctx->index,signature);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)auStack_88)
    ;
    if (uVar3 != '\x01') {
      return __return_storage_ptr__;
    }
  }
  conttype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Continuation> *)auStack_88,ctx);
  uVar3 = type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_;
  if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                      auStack_88);
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)auStack_c8,
                    (_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)auStack_88)
    ;
    if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
    {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,auStack_c8,
                 (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage.params.id + (long)auStack_c8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_50 == &local_40) {
        *puVar1 = CONCAT71(uStack_3f,local_40);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_50;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_3f,local_40);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
      local_48 = 0;
      local_40 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_50 = &local_40;
      std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                        auStack_c8);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                        auStack_c8);
      TypeBuilder::setHeapType(ctx->builder,(ulong)ctx->index,(Continuation)auStack_88);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                      auStack_88);
    if (uVar3 != '\x01') {
      return __return_storage_ptr__;
    }
  }
  structtype<wasm::WATParser::ParseTypeDefsCtx>
            ((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
              *)auStack_88,ctx);
  if (local_58 == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                         *)auStack_88);
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       *)auStack_c8,
                      (_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       *)auStack_88);
    if (local_98 == '\x02') {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,auStack_c8,
                 (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage.params.id + (long)auStack_c8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_50 == &local_40) {
        *puVar1 = CONCAT71(uStack_3f,local_40);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_50;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_3f,local_40);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
      local_48 = 0;
      local_40 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_50 = &local_40;
      std::__detail::__variant::
      _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                           *)auStack_c8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                           *)auStack_c8);
      type_00 = (StructT *)0x0;
      if (local_58 == '\0') {
        type_00 = (StructT *)auStack_88;
      }
      ParseTypeDefsCtx::addStructType(ctx,type_00);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                         *)auStack_88);
    if (local_58 != '\x01') {
      return __return_storage_ptr__;
    }
  }
  arraytype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Array> *)auStack_88,ctx);
  uVar3 = type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_;
  if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_88);
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_c8,
                    (_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_88);
    if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
    {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,auStack_c8,
                 (long)_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage.params.id + (long)auStack_c8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_50 == &local_40) {
        *puVar1 = CONCAT71(uStack_3f,local_40);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_50;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_3f,local_40);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
      local_48 = 0;
      local_40 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_50 = &local_40;
      std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_c8);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_c8);
      p_Var5 = (_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)0x0;
      if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0')
      {
        p_Var5 = (_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_88;
      }
      auStack_c8 = (undefined1  [8])
                   (p_Var5->super__Variant_storage_alias<wasm::Array,_wasm::None,_wasm::Err>)._M_u.
                   _M_first._M_storage.element.type.id;
      _val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._0_4_ =
           *(PackedType *)
            ((long)&(p_Var5->super__Variant_storage_alias<wasm::Array,_wasm::None,_wasm::Err>)._M_u
            + 8);
      _val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._4_4_ =
           *(Mutability *)
            ((long)&(p_Var5->super__Variant_storage_alias<wasm::Array,_wasm::None,_wasm::Err>)._M_u
            + 0xc);
      TypeBuilder::setHeapType(ctx->builder,(ulong)ctx->index,(Array *)auStack_c8);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)auStack_88);
    if (uVar3 != '\x01') {
      return __return_storage_ptr__;
    }
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"expected type description","");
  Lexer::err((Err *)auStack_88,&ctx->in,&local_e8);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
  TVar2.id = (long)&type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err> + 8;
  if (auStack_88 == (undefined1  [8])TVar2.id) {
    *puVar1 = CONCAT71(type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage.results.id._1_7_,
                       type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage.results.id._0_1_);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
         type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._16_8_;
  }
  else {
    *(undefined1 (*) [8])
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = auStack_88;
    *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
         CONCAT71(type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first
                  ._M_storage.results.id._1_7_,
                  type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first
                  ._M_storage.results.id._0_1_);
  }
  ((Type *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->id =
       (uintptr_t)
       type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
       super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
       super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
       super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
       super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
       super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first._M_storage
       .params.id;
  type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.
  params.id = (Type)0;
  type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.
  results.id._0_1_ = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    auStack_88 = (undefined1  [8])TVar2;
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> comptype(Ctx& ctx) {
  if (auto type = functype(ctx)) {
    CHECK_ERR(type);
    ctx.addFuncType(*type);
    return Ok{};
  }
  if (auto type = conttype(ctx)) {
    CHECK_ERR(type);
    ctx.addContType(*type);
    return Ok{};
  }
  if (auto type = structtype(ctx)) {
    CHECK_ERR(type);
    ctx.addStructType(*type);
    return Ok{};
  }
  if (auto type = arraytype(ctx)) {
    CHECK_ERR(type);
    ctx.addArrayType(*type);
    return Ok{};
  }
  return ctx.in.err("expected type description");
}